

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

optional<CService> *
Lookup(string *name,uint16_t portDefault,bool fAllowLookup,DNSLookupFn *dns_lookup_function)

{
  long lVar1;
  bool bVar2;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_RDI;
  vector<CService,_std::allocator<CService>_> *in_R8;
  long in_FS_OFFSET;
  vector<CService,_std::allocator<CService>_> services;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_ffffffffffffff48;
  CService *in_stack_ffffffffffffff50;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *pfVar3;
  DNSLookupFn *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  uint16_t in_stack_ffffffffffffffce;
  string *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pfVar3 = in_RDI;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function(in_RDI,in_RDI);
  Lookup(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,(bool)in_stack_ffffffffffffffcd,
         in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function(in_stack_ffffffffffffff48);
  bVar2 = std::vector<CService,_std::allocator<CService>_>::empty(in_R8);
  if (bVar2) {
    std::optional<CService>::optional((optional<CService> *)in_RDI);
  }
  else {
    std::vector<CService,_std::allocator<CService>_>::front
              ((vector<CService,_std::allocator<CService>_> *)in_stack_ffffffffffffff50);
    std::make_optional<CService_const&>(in_stack_ffffffffffffff50);
  }
  std::vector<CService,_std::allocator<CService>_>::~vector(in_R8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<CService> *)pfVar3;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CService> Lookup(const std::string& name, uint16_t portDefault, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    const std::vector<CService> services{Lookup(name, portDefault, fAllowLookup, 1, dns_lookup_function)};

    return services.empty() ? std::nullopt : std::make_optional(services.front());
}